

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

lua_Number lj_lib_checknum(lua_State *L,int narg)

{
  int iVar1;
  long lVar2;
  TValue *o_00;
  int in_ESI;
  long in_RDI;
  TValue *o;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar2 = *(long *)(in_RDI + 0x10) + (long)in_ESI * 8;
  o_00 = (TValue *)(lVar2 + -8);
  if (o_00 < *(TValue **)(in_RDI + 0x18)) {
    if (*(uint *)(lVar2 + -4) < 0xffff0000) {
LAB_001885d9:
      return (lua_Number)o_00->u64;
    }
    if (*(int *)(lVar2 + -4) == -5) {
      iVar1 = lj_strscan_num((GCstr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),o_00);
      if (iVar1 != 0) goto LAB_001885d9;
    }
  }
  lj_err_argt((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)o_00 >> 0x20),
              (int)o_00);
}

Assistant:

lua_Number lj_lib_checknum(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (!(o < L->top &&
	(tvisnumber(o) || (tvisstr(o) && lj_strscan_num(strV(o), o)))))
    lj_err_argt(L, narg, LUA_TNUMBER);
  if (LJ_UNLIKELY(tvisint(o))) {
    lua_Number n = (lua_Number)intV(o);
    setnumV(o, n);
    return n;
  } else {
    return numV(o);
  }
}